

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::Convolution3DLayerParams::_InternalParse
          (Convolution3DLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  WeightParams *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar4;
  char cVar5;
  uint32_t tag;
  char *local_50;
  uint local_44;
  RepeatedField<unsigned_long> *local_40;
  InternalMetadata *local_38;
  
  local_40 = &this->outputshape_;
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_50 = ptr;
LAB_001fa74c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) {
      return local_50;
    }
    local_50 = google::protobuf::internal::ReadTag(local_50,&local_44,0);
    tag_00 = local_44;
    uVar4 = local_44 >> 3;
    cVar5 = (char)local_44;
    switch(uVar4) {
    case 0x46:
      if (cVar5 != '0') goto switchD_001fa83d_caseD_17;
      uVar3 = google::protobuf::internal::ReadVarint64(&local_50);
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
      this->paddingtype_ = (int)uVar3;
      goto LAB_001fa74c;
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
      goto switchD_001fa83d_caseD_17;
    case 0x50:
      goto switchD_001fa83d_caseD_17;
    case 0x51:
      if (cVar5 != -0x78) goto switchD_001fa83d_caseD_17;
      uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
      this->custompaddingback_ = uVar2;
      break;
    case 0x52:
      if (cVar5 != -0x70) goto switchD_001fa83d_caseD_17;
      uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
      this->custompaddingtop_ = uVar2;
      break;
    case 0x53:
      if (cVar5 != -0x68) goto switchD_001fa83d_caseD_17;
      uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
      this->custompaddingbottom_ = uVar2;
      break;
    case 0x54:
      if (cVar5 != -0x60) goto switchD_001fa83d_caseD_17;
      uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
      this->custompaddingleft_ = uVar2;
      break;
    case 0x55:
      if (cVar5 != -0x58) goto switchD_001fa83d_caseD_17;
      uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
      this->custompaddingright_ = uVar2;
      break;
    case 0x56:
      if (cVar5 != -0x50) goto switchD_001fa83d_caseD_17;
      uVar3 = google::protobuf::internal::ReadVarint64(&local_50);
      this->isdeconvolution_ = uVar3 != 0;
      break;
    case 0x57:
      if (cVar5 == -0x46) {
        local_50 = google::protobuf::internal::PackedUInt64Parser(local_40,local_50,ctx);
      }
      else {
        if ((local_44 & 0xff) != 0xb8) goto switchD_001fa83d_caseD_17;
        uVar3 = google::protobuf::internal::ReadVarint64(&local_50);
        _internal_add_outputshape(this,uVar3);
      }
      break;
    default:
      switch(uVar4) {
      case 0x14:
        if (cVar5 == -0x60) {
          uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
          this->kerneldepth_ = uVar2;
          goto joined_r0x001faa6e;
        }
        break;
      case 0x15:
        if (cVar5 == -0x58) {
          uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
          this->kernelheight_ = uVar2;
          goto joined_r0x001faa6e;
        }
        break;
      case 0x16:
        if (cVar5 == -0x50) {
          uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
          this->kernelwidth_ = uVar2;
          goto joined_r0x001faa6e;
        }
        break;
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
        break;
      case 0x1f:
        if (cVar5 == -8) {
          uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
          this->stridedepth_ = uVar2;
          goto joined_r0x001faa6e;
        }
        break;
      case 0x20:
        if (cVar5 == '\0') {
          uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
          this->strideheight_ = uVar2;
          goto joined_r0x001faa6e;
        }
        break;
      case 0x21:
        if (cVar5 == '\b') {
          uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
          this->stridewidth_ = uVar2;
          goto joined_r0x001faa6e;
        }
        break;
      default:
        if (uVar4 == 0x3d) {
          if (cVar5 == -0x16) {
            msg = _internal_mutable_bias(this);
LAB_001faa84:
            local_50 = google::protobuf::internal::ParseContext::ParseMessage
                                 (ctx,&msg->super_MessageLite,local_50);
            goto joined_r0x001faa6e;
          }
        }
        else if (uVar4 == 2) {
          if (cVar5 == '\x10') {
            uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
            this->inputchannels_ = uVar2;
            goto joined_r0x001faa6e;
          }
        }
        else if (uVar4 == 10) {
          if (cVar5 == 'P') {
            uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
            this->ngroups_ = uVar2;
            goto joined_r0x001faa6e;
          }
        }
        else if (uVar4 == 0x28) {
          if (cVar5 == '@') {
            uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
            this->dilationdepth_ = uVar2;
            goto joined_r0x001faa6e;
          }
        }
        else if (uVar4 == 0x29) {
          if (cVar5 == 'H') {
            uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
            this->dilationheight_ = uVar2;
            goto joined_r0x001faa6e;
          }
        }
        else if (uVar4 == 0x2a) {
          if (cVar5 == 'P') {
            uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
            this->dilationwidth_ = uVar2;
            goto joined_r0x001faa6e;
          }
        }
        else if (uVar4 == 0x32) {
          if (cVar5 == -0x70) {
            uVar3 = google::protobuf::internal::ReadVarint64(&local_50);
            this->hasbias_ = uVar3 != 0;
            goto joined_r0x001faa6e;
          }
        }
        else if (uVar4 == 0x3c) {
          if (cVar5 == -0x1e) {
            msg = _internal_mutable_weights(this);
            goto LAB_001faa84;
          }
        }
        else if ((uVar4 == 1) && (cVar5 == '\b')) {
          uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
          this->outputchannels_ = uVar2;
          goto joined_r0x001faa6e;
        }
      }
switchD_001fa83d_caseD_17:
      if ((local_44 == 0) || ((local_44 & 7) == 4)) {
        if (local_50 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
        return local_50;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_38);
      local_50 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_50,ctx);
    }
joined_r0x001faa6e:
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Convolution3DLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int32 outputChannels = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          outputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 inputChannels = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          inputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 nGroups = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          ngroups_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelDepth = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 160)) {
          kerneldepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelHeight = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 168)) {
          kernelheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelWidth = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 176)) {
          kernelwidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideDepth = 31;
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 248)) {
          stridedepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideHeight = 32;
      case 32:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 0)) {
          strideheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideWidth = 33;
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          stridewidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationDepth = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 64)) {
          dilationdepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationHeight = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 72)) {
          dilationheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationWidth = 42;
      case 42:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          dilationwidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool hasBias = 50;
      case 50:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          hasbias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams weights = 60;
      case 60:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 226)) {
          ptr = ctx->ParseMessage(_internal_mutable_weights(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams bias = 61;
      case 61:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 234)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
      case 70:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_paddingtype(static_cast<::CoreML::Specification::Convolution3DLayerParams_PaddingType>(val));
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingFront = 80;
      case 80:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 128)) {
          custompaddingfront_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingBack = 81;
      case 81:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 136)) {
          custompaddingback_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingTop = 82;
      case 82:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          custompaddingtop_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingBottom = 83;
      case 83:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 152)) {
          custompaddingbottom_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingLeft = 84;
      case 84:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 160)) {
          custompaddingleft_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingRight = 85;
      case 85:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 168)) {
          custompaddingright_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool isDeconvolution = 86;
      case 86:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 176)) {
          isdeconvolution_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated uint64 outputShape = 87;
      case 87:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_outputshape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 184) {
          _internal_add_outputshape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}